

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

BOOL MoveFileExA(LPCSTR lpExistingFileName,LPCSTR lpNewFileName,DWORD dwFlags)

{
  long lVar1;
  int iVar2;
  BOOL BVar3;
  size_t sVar4;
  char *pcVar5;
  SIZE_T SVar6;
  int *piVar7;
  long in_FS_OFFSET;
  undefined1 local_178 [8];
  stat buf;
  DWORD local_e0;
  BOOL bFailIfExists;
  DWORD dwLastError;
  BOOL bRet;
  char *dest;
  char *source;
  int local_b8;
  int local_b4;
  int length;
  int result;
  CPalThread *pThread;
  LPCSTR pCStack_a0;
  DWORD dwFlags_local;
  LPCSTR lpNewFileName_local;
  LPCSTR lpExistingFileName_local;
  PathCharString destPS;
  PathCharString sourcePS;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8 = 0;
  pThread._4_4_ = dwFlags;
  pCStack_a0 = lpNewFileName;
  lpNewFileName_local = lpExistingFileName;
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&destPS.m_count);
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpExistingFileName_local);
  bFailIfExists = 1;
  local_e0 = 0;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  _length = CorUnix::InternalGetCurrentThread();
  if ((pThread._4_4_ & 0xfffffffc) == 0) {
    sVar4 = strlen(lpNewFileName_local);
    local_b8 = (int)sVar4;
    pcVar5 = StackString<32UL,_char>::OpenStringBuffer
                       ((StackString<32UL,_char> *)&destPS.m_count,(long)local_b8);
    dest = pcVar5;
    if (pcVar5 == (char *)0x0) {
      local_e0 = 8;
    }
    else {
      SVar6 = StackString<32UL,_char>::GetSizeOf((StackString<32UL,_char> *)&destPS.m_count);
      strcpy_s(pcVar5,SVar6,lpNewFileName_local);
      StackString<32UL,_char>::CloseBuffer
                ((StackString<32UL,_char> *)&destPS.m_count,(long)local_b8);
      FILEDosToUnixPathA(dest);
      sVar4 = strlen(pCStack_a0);
      local_b8 = (int)sVar4;
      pcVar5 = StackString<32UL,_char>::OpenStringBuffer
                         ((StackString<32UL,_char> *)&lpExistingFileName_local,(long)local_b8);
      _dwLastError = pcVar5;
      if (pcVar5 == (char *)0x0) {
        local_e0 = 8;
      }
      else {
        SVar6 = StackString<32UL,_char>::GetSizeOf
                          ((StackString<32UL,_char> *)&lpExistingFileName_local);
        strcpy_s(pcVar5,SVar6,pCStack_a0);
        StackString<32UL,_char>::CloseBuffer
                  ((StackString<32UL,_char> *)&lpExistingFileName_local,(long)local_b8);
        FILEDosToUnixPathA(_dwLastError);
        if ((((pThread._4_4_ & 1) == 0) && (iVar2 = strcasecmp(dest,_dwLastError), iVar2 != 0)) &&
           (iVar2 = access(_dwLastError,0), iVar2 == 0)) {
          local_e0 = 0xb7;
        }
        else {
          local_b4 = rename(dest,_dwLastError);
          if (((local_b4 < 0) && ((pThread._4_4_ & 1) != 0)) &&
             ((piVar7 = __errno_location(), *piVar7 == 0x14 ||
              (piVar7 = __errno_location(), *piVar7 == 0x11)))) {
            bFailIfExists = DeleteFileA(pCStack_a0);
            if (bFailIfExists == 0) {
              local_e0 = GetLastError();
            }
            else {
              local_b4 = rename(dest,_dwLastError);
            }
          }
          if (local_b4 < 0) {
            piVar7 = __errno_location();
            iVar2 = *piVar7;
            if (iVar2 == 2) {
              iVar2 = lstat64(dest,(stat64 *)local_178);
              if (iVar2 == -1) {
                FILEGetProperNotFoundError(dest,&local_e0);
              }
              else {
                local_e0 = 3;
              }
            }
            else if (iVar2 == 0x12) {
              if ((pThread._4_4_ & 2) == 0) {
                local_e0 = 5;
              }
              else {
                buf.__glibc_reserved[2]._4_4_ = (uint)((pThread._4_4_ & 1) == 0);
                bFailIfExists =
                     CopyFileA(lpNewFileName_local,pCStack_a0,buf.__glibc_reserved[2]._4_4_);
                if (bFailIfExists == 0) {
                  local_e0 = GetLastError();
                }
                else {
                  BVar3 = DeleteFileA(lpNewFileName_local);
                  if (BVar3 == 0) {
                    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                      abort();
                    }
                    local_e0 = GetLastError();
                    BVar3 = DeleteFileA(pCStack_a0);
                    if ((BVar3 == 0) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
                      abort();
                    }
                  }
                }
              }
            }
            else if (iVar2 == 0x16) {
              local_e0 = 0x20;
            }
            else {
              local_e0 = FILEGetLastErrorFromErrno();
            }
          }
        }
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","MoveFileExA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0x586);
    fprintf(_stderr,"dwFlags is invalid\n");
    local_e0 = 0x57;
  }
  if (local_e0 != 0) {
    CorUnix::CPalThread::SetLastError(local_e0);
    bFailIfExists = 0;
  }
  BVar3 = bFailIfExists;
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpExistingFileName_local);
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&destPS.m_count);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
      __stack_chk_fail();
    }
    return BVar3;
  }
  abort();
}

Assistant:

BOOL
PALAPI
MoveFileExA(
        IN LPCSTR lpExistingFileName,
        IN LPCSTR lpNewFileName,
        IN DWORD dwFlags)
{
    CPalThread *pThread;
    int   result;
    int length = 0;
    PathCharString sourcePS;
    PathCharString destPS;
    char * source;
    char * dest;
    BOOL  bRet = TRUE;
    DWORD dwLastError = 0;

    PERF_ENTRY(MoveFileExA);
    ENTRY("MoveFileExA(lpExistingFileName=%p (%S), lpNewFileName=%p (%S), "
          "dwFlags=%#x)\n",
          lpExistingFileName?lpExistingFileName:"NULL",
          lpExistingFileName?lpExistingFileName:"NULL",
          lpNewFileName?lpNewFileName:"NULL",
          lpNewFileName?lpNewFileName:"NULL", dwFlags);

    pThread = InternalGetCurrentThread();
    /* only two flags are accepted */
    if ( dwFlags & ~(MOVEFILE_COPY_ALLOWED | MOVEFILE_REPLACE_EXISTING) )
    {
        ASSERT( "dwFlags is invalid\n" );
        dwLastError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    length = strlen(lpExistingFileName);
    
    source = sourcePS.OpenStringBuffer(length);
    if (NULL == source)
    {
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    strcpy_s( source, sourcePS.GetSizeOf(), lpExistingFileName);
    sourcePS.CloseBuffer(length);
    
    FILEDosToUnixPathA( source );

    length = strlen(lpNewFileName);
    
    dest = destPS.OpenStringBuffer(length);
    if (NULL == dest)
    {
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    strcpy_s( dest, destPS.GetSizeOf(), lpNewFileName);
    destPS.CloseBuffer(length);
    
    FILEDosToUnixPathA( dest );

    if ( !(dwFlags & MOVEFILE_REPLACE_EXISTING) )
    {
#if HAVE_CASE_SENSITIVE_FILESYSTEM
        if ( strcmp(source, dest) != 0 )
#else   // HAVE_CASE_SENSITIVE_FILESYSTEM
        if ( strcasecmp(source, dest) != 0 )
#endif  // HAVE_CASE_SENSITIVE_FILESYSTEM
        {
            // Let things proceed normally if source and
            // dest are the same.
            if ( access(dest, F_OK) == 0 )
            {
                dwLastError = ERROR_ALREADY_EXISTS;
                goto done;
            }
        }
    }

    result = rename( source, dest );
    if ((result < 0) && (dwFlags & MOVEFILE_REPLACE_EXISTING) &&
        ((errno == ENOTDIR) || (errno == EEXIST)))
    {
        bRet = DeleteFileA( lpNewFileName );
        
        if ( bRet ) 
        {
            result = rename( source, dest );
        }
        else
        { 
            dwLastError = GetLastError();
        }
    } 

    if ( result < 0 )
    {
        switch( errno )
        {
        case EXDEV: /* we tried to link across devices */
        
            if ( dwFlags & MOVEFILE_COPY_ALLOWED )
            {
                BOOL bFailIfExists = !(dwFlags & MOVEFILE_REPLACE_EXISTING);
            
                /* if CopyFile fails here, so should MoveFailEx */
                bRet = CopyFileA( lpExistingFileName,
                          lpNewFileName,
                          bFailIfExists );
                /* CopyFile should set the appropriate error */
                if ( !bRet ) 
                {
                    dwLastError = GetLastError();
                }
                else
                {
                    if (!DeleteFileA(lpExistingFileName))
                    {
                        ERROR("Failed to delete the source file\n");
                        dwLastError = GetLastError();
                    
                        /* Delete the destination file if we're unable to delete 
                           the source file */
                        if (!DeleteFileA(lpNewFileName))
                        {
                            ERROR("Failed to delete the destination file\n");
                        }
                    }
                }
            }
            else
            {
                dwLastError = ERROR_ACCESS_DENIED;
            }
            break;
        case EINVAL: // tried to rename "." or ".."
            dwLastError = ERROR_SHARING_VIOLATION;
            break;
        case ENOENT:
            {
                struct stat buf;
                if (lstat(source, &buf) == -1)
                {
                    FILEGetProperNotFoundError(source, &dwLastError);
                }
                else
                {
                    dwLastError = ERROR_PATH_NOT_FOUND;
                }
            }
            break;
        default:
            dwLastError = FILEGetLastErrorFromErrno();
            break;
        }
    }

done:
    if ( dwLastError )
    {
        pThread->SetLastError( dwLastError );
        bRet = FALSE;
    }

    LOGEXIT( "MoveFileExA returns BOOL %d\n", bRet );
    PERF_EXIT(MoveFileExA);
    return bRet;
}